

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_etc.c
# Opt level: O0

bool_t zzSqrt(word *b,word *a,size_t n,void *stack)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  word wVar4;
  word *in_RCX;
  size_t in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *unaff_retaddr;
  word *in_stack_00000008;
  word *r;
  word *t;
  size_t m;
  int cmp;
  size_t in_stack_ffffffffffffffa8;
  word *a_00;
  word *a_01;
  size_t local_38;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar5;
  
  local_38 = in_RDX + 1 >> 1;
  a_00 = in_RCX + local_38 + 1;
  sVar2 = wwWordSize(in_RSI,in_RDX);
  if (sVar2 == 0) {
    wwSetZero(in_RDI,local_38);
    bVar5 = 1;
  }
  else {
    wwSetZero(in_RCX,local_38 + 1);
    a_01 = in_RCX;
    sVar3 = wwBitSize(in_RCX,in_stack_ffffffffffffffa8);
    wwSetBit(in_RCX,sVar3 + 1 >> 1,1);
    zzSubW2(a_01,local_38 + 1,1);
    while( true ) {
      wwCopy(in_RDI,a_01,local_38);
      local_38 = wwWordSize(in_RDI,local_38);
      zzDiv(r,in_stack_00000008,unaff_retaddr,
            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,(size_t)in_RSI,
            (void *)m);
      if ((sVar2 - local_38 == local_38) && (a_01[local_38] != 0)) {
        return 0;
      }
      iVar1 = wwCmp(in_RDI,a_01,local_38);
      if (iVar1 == 0) {
        bVar5 = wwIsZero(a_00,local_38);
        return bVar5;
      }
      if (iVar1 < 0) break;
      wVar4 = zzAdd2(a_01,in_RDI,local_38);
      a_01[local_38] = wVar4;
      wwShLo(a_01,(size_t)a_00,(size_t)in_RCX);
    }
    bVar5 = 0;
  }
  return bVar5;
}

Assistant:

bool_t zzSqrt(word b[], const word a[], size_t n, void* stack)
{
	register int cmp;
	size_t m = (n + 1) / 2;
	word* t = (word*)stack;
	word* r = t + m + 1;
	stack = r + m;
	// pre
	ASSERT(wwIsDisjoint2(a, n, b, m));
	// нормализовать a и обработать a == 0
	if ((n = wwWordSize(a, n)) == 0)
	{
		wwSetZero(b, m);
		return TRUE;
	}
	// t <- 2^{(len(a) + 1) / 2} - 1 (умещается в m слов)
	wwSetZero(t, m + 1);
	wwSetBit(t, (wwBitSize(a, n) + 1) / 2, 1);
	zzSubW2(t, m + 1, 1);
	ASSERT(t[m] == 0);
	// итерации
	while (1)
	{
		// b <- t
		wwCopy(b, t, m);
		m = wwWordSize(b, m);
		// t <- a / b
		zzDiv(t, r, a, n, b, m, stack);
		// частное [n - m + 1]t включает ненулевое слово t[m] => t > b
		if (n - m == m && t[m] > 0)
			return FALSE;
		// сравнить [m]b и [m]t
		cmp = wwCmp(b, t, m);
		// b == t => a -- полный квадрат <=> r == 0
		if (cmp == 0)
			return wwIsZero(r, m);
		// b < t => выход, a -- не полный квадрат
		if (cmp < 0)
			break;
		// t <- (b + t) / 2
		t[m] = zzAdd2(t, b, m);
		wwShLo(t, m + 1, 1);
		ASSERT(t[m] == 0);
	}
	return FALSE;
}